

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS ref_collapse_edge_ratio(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  REF_INT cell;
  REF_DBL edge_ratio;
  REF_INT nodes [27];
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  REF_BOOL *local_c0;
  REF_GRID local_b8;
  ulong local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  *allowed = 0;
  lVar5 = 0x28;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    lVar5 = 0x50;
  }
  ref_cell = *(REF_CELL *)((long)ref_grid->cell + lVar5 + -0x10);
  uVar6 = 0xffffffff;
  if (-1 < node1) {
    uVar6 = 0xffffffff;
    if (node1 < ref_cell->ref_adj->nnode) {
      uVar6 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node1];
    }
  }
  local_c0 = allowed;
  local_b8 = ref_grid;
  if ((int)uVar6 == -1) {
    local_d8 = -1.0;
    local_e8 = -1.0;
    local_d0 = 1e+200;
    local_e0 = 1e+200;
  }
  else {
    cell = ref_cell->ref_adj->item[(int)uVar6].ref;
    local_e0 = 1e+200;
    local_d0 = 1e+200;
    local_e8 = -1.0;
    local_d8 = -1.0;
    do {
      uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x37b,"ref_collapse_edge_ratio",(ulong)uVar4,"nodes");
        return uVar4;
      }
      uVar4 = ref_cell->node_per;
      local_b0 = uVar6;
      if (0 < (int)uVar4) {
        lVar5 = 0;
        do {
          if (local_a8[lVar5] != node1) {
            uVar4 = ref_node_ratio(ref_node,node1,local_a8[lVar5],&local_c8);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x37f,"ref_collapse_edge_ratio",(ulong)uVar4,"ratio");
              return uVar4;
            }
            if (local_d8 <= local_c8) {
              local_d8 = local_c8;
            }
            if (local_c8 <= local_d0) {
              local_d0 = local_c8;
            }
          }
          lVar5 = lVar5 + 1;
          uVar4 = ref_cell->node_per;
        } while (lVar5 < (int)uVar4);
      }
      if ((int)uVar4 < 1) {
LAB_001a2b52:
        if (0 < ref_cell->node_per) {
          lVar5 = 0;
          do {
            if (local_a8[lVar5] != node1) {
              uVar4 = ref_node_ratio(ref_node,node0,local_a8[lVar5],&local_c8);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x38c,"ref_collapse_edge_ratio",(ulong)uVar4,"ratio");
                return uVar4;
              }
              if (local_e8 <= local_c8) {
                local_e8 = local_c8;
              }
              if (local_c8 <= local_e0) {
                local_e0 = local_c8;
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < ref_cell->node_per);
        }
      }
      else {
        uVar6 = 0;
        bVar3 = false;
        do {
          if (local_a8[uVar6] == node0) {
            bVar3 = true;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        if (!bVar3) goto LAB_001a2b52;
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)local_b0].next;
      uVar6 = (ulong)iVar1;
      if (uVar6 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar6].ref;
      }
    } while (iVar1 != -1);
  }
  if ((local_b8->adapt->post_min_ratio <= local_e0) && (local_e8 <= local_b8->adapt->post_max_ratio)
     ) {
    *local_c0 = 1;
  }
  if ((local_d0 <= local_e0) && (local_e8 <= local_d8)) {
    *local_c0 = 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_ratio(REF_GRID ref_grid, REF_INT node0,
                                           REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;
  REF_DBL edge_ratio;
  REF_DBL old_max, old_min, new_max, new_min;

  *allowed = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  old_max = -1.0;
  old_min = REF_DBL_MAX;
  new_max = -1.0;
  new_min = REF_DBL_MAX;
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 != nodes[node]) {
        RSS(ref_node_ratio(ref_node, node1, nodes[node], &edge_ratio), "ratio");
        old_max = MAX(old_max, edge_ratio);
        old_min = MIN(old_min, edge_ratio);
      }
    }

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 != nodes[node]) {
        RSS(ref_node_ratio(ref_node, node0, nodes[node], &edge_ratio), "ratio");
        new_max = MAX(new_max, edge_ratio);
        new_min = MIN(new_min, edge_ratio);
      }
  }

  if ((new_min >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
      (new_max <= ref_grid_adapt(ref_grid, post_max_ratio))) {
    *allowed = REF_TRUE;
  }

  if (new_min >= old_min && new_max <= old_max) {
    *allowed = REF_TRUE;
  }

  return REF_SUCCESS;
}